

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

wchar_t format_numeric_keypad_key(char *buf,Terminal *term,char key,_Bool shift,_Bool ctrl)

{
  wchar_t wVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  int iVar8;
  char *__format;
  byte bVar9;
  
  if (term->app_keypad_keys == true) {
    bVar7 = term->no_applic_k ^ 1;
  }
  else {
    bVar7 = 0;
  }
  iVar8 = (int)buf;
  if (((byte)(key - 0x31U) < 9) && (term->nethack_keypad != false)) {
    uVar4 = (byte)key - 0x31;
    bVar7 = "bjnh.lyku"[uVar4];
    bVar9 = bVar7 - 0x20;
    if (!shift) {
      bVar9 = bVar7;
    }
    if (uVar4 == 4) {
      bVar9 = bVar7;
    }
    bVar7 = bVar7 & 0x1f;
    if (!ctrl) {
      bVar7 = bVar9;
    }
    if (uVar4 == 4) {
      bVar7 = bVar9;
    }
    *buf = bVar7;
    iVar6 = iVar8 + 1;
    goto LAB_0010ee3d;
  }
  wVar1 = term->funky_type;
  uVar4 = 0;
  bVar2 = true;
  iVar5 = (int)key;
  if ((wVar1 == L'\x03') || ((wVar1 < L'\x02' & bVar7) != 0)) {
    if (iVar5 == 0x2a) {
      uVar4 = 0x52;
    }
    else if (iVar5 == 0x2d) {
      uVar4 = 0x53;
    }
    else if (iVar5 == 0x2f) {
      uVar4 = 0x51;
    }
    else {
      if (iVar5 != 0x47) goto LAB_0010ed65;
      uVar4 = 0x50;
    }
    bVar2 = false;
  }
LAB_0010ed65:
  iVar6 = iVar8;
  if (bVar7 == 0) {
switchD_0010ed82_caseD_2c:
    if (bVar2) goto LAB_0010ee3d;
    goto LAB_0010ee02;
  }
  switch(iVar5) {
  case 0x2a:
    uVar3 = 0x6a;
    goto LAB_0010edcf;
  case 0x2b:
    if (wVar1 == L'\x02') {
      uVar4 = shift + 0x6b;
    }
    else {
      uVar4 = shift | 0x6c;
    }
    break;
  case 0x2c:
    goto switchD_0010ed82_caseD_2c;
  case 0x2d:
    uVar3 = 0x6d;
    goto LAB_0010edcf;
  case 0x2e:
    uVar4 = 0x6e;
    break;
  case 0x2f:
    uVar3 = 0x6f;
LAB_0010edcf:
    if (wVar1 == L'\x02') {
      uVar4 = uVar3;
    }
    if ((bool)(wVar1 != L'\x02' & bVar2)) goto LAB_0010ee3d;
    break;
  case 0x30:
    uVar4 = 0x70;
    break;
  case 0x31:
    uVar4 = 0x71;
    break;
  case 0x32:
    uVar4 = 0x72;
    break;
  case 0x33:
    uVar4 = 0x73;
    break;
  case 0x34:
    uVar4 = 0x74;
    break;
  case 0x35:
    uVar4 = 0x75;
    break;
  case 0x36:
    uVar4 = 0x76;
    break;
  case 0x37:
    uVar4 = 0x77;
    break;
  case 0x38:
    uVar4 = 0x78;
    break;
  case 0x39:
    uVar4 = 0x79;
    break;
  default:
    if (iVar5 != 0xd) goto switchD_0010ed82_caseD_2c;
    uVar4 = 0x4d;
  }
LAB_0010ee02:
  if (term->vt52_mode == true) {
    if ((uVar4 & 0xfffffffc) == 0x50) {
      __format = "\x1b%c";
    }
    else {
      __format = "\x1b?%c";
    }
  }
  else {
    __format = "\x1bO%c";
  }
  iVar6 = sprintf(buf,__format);
  iVar6 = iVar6 + iVar8;
LAB_0010ee3d:
  return iVar6 - iVar8;
}

Assistant:

int format_numeric_keypad_key(char *buf, Terminal *term, char key,
                              bool shift, bool ctrl)
{
    char *p = buf;
    bool app_keypad = (term->app_keypad_keys && !term->no_applic_k);

    if (term->nethack_keypad && (key >= '1' && key <= '9')) {
        static const char nh_base[] = "bjnh.lyku";
        char c = nh_base[key - '1'];
        if (ctrl && c != '.')
            c &= 0x1F;
        else if (shift && c != '.')
            c += 'A'-'a';
        *p++ = c;
    } else {
        int xkey = 0;

        if (term->funky_type == FUNKY_VT400 ||
            (term->funky_type <= FUNKY_LINUX && app_keypad)) {
            switch (key) {
              case 'G': xkey = 'P'; break;
              case '/': xkey = 'Q'; break;
              case '*': xkey = 'R'; break;
              case '-': xkey = 'S'; break;
            }
        }

        if (app_keypad) {
            switch (key) {
              case '0': xkey = 'p'; break;
              case '1': xkey = 'q'; break;
              case '2': xkey = 'r'; break;
              case '3': xkey = 's'; break;
              case '4': xkey = 't'; break;
              case '5': xkey = 'u'; break;
              case '6': xkey = 'v'; break;
              case '7': xkey = 'w'; break;
              case '8': xkey = 'x'; break;
              case '9': xkey = 'y'; break;
              case '.': xkey = 'n'; break;
              case '\r': xkey = 'M'; break;

              case '+':
                /*
                 * Keypad + is tricky. It covers a space that would
                 * be taken up on the VT100 by _two_ keys; so we
                 * let Shift select between the two. Worse still,
                 * in xterm function key mode we change which two...
                 */
                if (term->funky_type == FUNKY_XTERM)
                    xkey = shift ? 'l' : 'k';
                else
                    xkey = shift ? 'm' : 'l';
                break;

              case '/':
                if (term->funky_type == FUNKY_XTERM)
                    xkey = 'o';
                break;
              case '*':
                if (term->funky_type == FUNKY_XTERM)
                    xkey = 'j';
                break;
              case '-':
                if (term->funky_type == FUNKY_XTERM)
                    xkey = 'm';
                break;
            }
        }

        if (xkey) {
            if (term->vt52_mode) {
                if (xkey >= 'P' && xkey <= 'S')
                    p += sprintf(p, "\x1B%c", xkey);
                else
                    p += sprintf(p, "\x1B?%c", xkey);
            } else
                p += sprintf(p, "\x1BO%c", xkey);
        }
    }

    return p - buf;
}